

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::GetDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  bool bVar1;
  char *__s;
  allocator<char> local_36;
  allocator<char> local_35 [16];
  allocator<char> local_25;
  BaseType local_24;
  FieldDef *pFStack_20;
  BaseType base_type;
  FieldDef *field_local;
  PythonGenerator *this_local;
  
  local_24 = (field->value).type.base_type;
  pFStack_20 = field;
  field_local = (FieldDef *)this;
  this_local = (PythonGenerator *)__return_storage_ptr__;
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else {
    bVar1 = IsBool(local_24);
    if (bVar1) {
      bVar1 = std::operator==(&(pFStack_20->value).constant,"0");
      __s = "True";
      if (bVar1) {
        __s = "False";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,local_35);
      std::allocator<char>::~allocator(local_35);
    }
    else {
      bVar1 = IsFloat(local_24);
      if (bVar1) {
        FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                  (__return_storage_ptr__,&(this->float_const_gen_).super_FloatConstantGenerator,
                   pFStack_20);
      }
      else {
        bVar1 = IsInteger(local_24);
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&(pFStack_20->value).constant);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"None",&local_36);
          std::allocator<char>::~allocator(&local_36);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefaultValue(const FieldDef &field) const {
    BaseType base_type = field.value.type.base_type;
    if (field.IsScalarOptional()) {
      return "None";
    } else if (IsBool(base_type)) {
      return field.value.constant == "0" ? "False" : "True";
    } else if (IsFloat(base_type)) {
      return float_const_gen_.GenFloatConstant(field);
    } else if (IsInteger(base_type)) {
      return field.value.constant;
    } else {
      // For string, struct, and table.
      return "None";
    }
  }